

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O0

void __thiscall
ParseNodeWhile::ParseNodeWhile
          (ParseNodeWhile *this,OpCode nop,charcount_t ichMin,charcount_t ichLim)

{
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  OpCode nop_local;
  ParseNodeWhile *this_local;
  
  ParseNodeStmt::ParseNodeStmt(&this->super_ParseNodeStmt,nop,ichMin,ichLim);
  return;
}

Assistant:

ParseNodeWhile::ParseNodeWhile(OpCode nop, charcount_t ichMin, charcount_t ichLim)
    : ParseNodeStmt(nop, ichMin, ichLim)
{
}